

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_for(LexState *ls,BCLine line)

{
  FuncState *fs_00;
  undefined1 local_38 [8];
  FuncScope bl;
  GCstr *varname;
  FuncState *fs;
  BCLine line_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  fscope_begin(fs_00,(FuncScope *)local_38,1);
  lj_lex_next(ls);
  bl._8_8_ = lex_str(ls);
  if (ls->tok == 0x3d) {
    parse_for_num(ls,(GCstr *)bl._8_8_,line);
  }
  else {
    if ((ls->tok != 0x2c) && (ls->tok != 0x10c)) {
      err_syntax(ls,LJ_ERR_XFOR);
    }
    parse_for_iter(ls,(GCstr *)bl._8_8_);
  }
  lex_match(ls,0x106,0x108,line);
  fscope_end(fs_00);
  return;
}

Assistant:

static void parse_for(LexState *ls, BCLine line)
{
  FuncState *fs = ls->fs;
  GCstr *varname;
  FuncScope bl;
  fscope_begin(fs, &bl, FSCOPE_LOOP);
  lj_lex_next(ls);  /* Skip 'for'. */
  varname = lex_str(ls);  /* Get first variable name. */
  if (ls->tok == '=')
    parse_for_num(ls, varname, line);
  else if (ls->tok == ',' || ls->tok == TK_in)
    parse_for_iter(ls, varname);
  else
    err_syntax(ls, LJ_ERR_XFOR);
  lex_match(ls, TK_end, TK_for, line);
  fscope_end(fs);  /* Resolve break list. */
}